

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

float ToLinearHlg(float gamma)

{
  float in_XMM0_Da;
  undefined4 local_4;
  
  if (0.0 <= in_XMM0_Da) {
    if (0.5 < in_XMM0_Da) {
      expf((in_XMM0_Da - 0.5599107) / 0.17883277);
      local_4 = Powf(0.0,2.420142e-39);
    }
    else {
      local_4 = Powf(0.0,2.420028e-39);
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float ToLinearHlg(float gamma) {
  if (gamma < 0.f) {
    return 0.f;
  } else if (gamma <= 0.5f) {
    return Powf((gamma * gamma) * (1.f / 3.f), 1.2f);
  }
  return Powf((expf((gamma - 0.55991073f) / 0.17883277f) + 0.28466892f) / 12.0f,
              1.2f);
}